

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalGenerator::CreateUtilityOutput
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *targetName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_2,cmListFileBacktrace *param_3)

{
  string *psVar1;
  cmSourceFile *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  undefined1 local_50 [32];
  size_type local_30;
  pointer local_28;
  
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)local_50,&(this->super_cmOutputConverter).StateSnapshot);
  psVar1 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_50);
  local_50._8_8_ = (psVar1->_M_dataplus)._M_p;
  local_50._0_8_ = psVar1->_M_string_length;
  local_50._16_8_ = (cmState *)0xc;
  local_50._24_8_ = (long)"**/CMakeFiles/" + 2;
  local_28 = (targetName->_M_dataplus)._M_p;
  local_30 = targetName->_M_string_length;
  views._M_len = 3;
  views._M_array = (iterator)local_50;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  this_00 = cmMakefile::GetOrCreateGeneratedSource(this->Makefile,__return_storage_ptr__);
  if (this_00 == (cmSourceFile *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "Could not get source file entry for ",__return_storage_ptr__);
    cmSystemTools::Error((string *)local_50);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_50._0_8_ ==
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_50 + 0x10)) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_50._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_50 + 0x10)
    ;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"SYMBOLIC","");
    cmSourceFile::SetProperty(this_00,(string *)local_50,"1");
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_50._0_8_ ==
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_50 + 0x10)) {
      return __return_storage_ptr__;
    }
  }
  operator_delete((void *)local_50._0_8_,(ulong)(local_50._16_8_ + 1));
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::CreateUtilityOutput(
  std::string const& targetName, std::vector<std::string> const&,
  cmListFileBacktrace const&)
{
  std::string force =
    cmStrCat(this->GetCurrentBinaryDirectory(), "/CMakeFiles/", targetName);
  // The output is not actually created so mark it symbolic.
  if (cmSourceFile* sf = this->Makefile->GetOrCreateGeneratedSource(force)) {
    sf->SetProperty("SYMBOLIC", "1");
  } else {
    cmSystemTools::Error("Could not get source file entry for " + force);
  }
  return force;
}